

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_test.cpp
# Opt level: O2

void __thiscall Parallel_ForEachThread_Test::TestBody(Parallel_ForEachThread_Test *this)

{
  char *message;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertHelper local_48;
  atomic<int> count;
  AssertionResult gtest_ar;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  count.super___atomic_base<int>._M_i = (__atomic_base<int>)pbrt::MaxThreadIndex();
  local_28._M_unused._M_object = &count;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:44:19)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp:44:19)>
             ::_M_manager;
  pbrt::ForEachThread((function<void_()> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  local_50.ptr_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,std::atomic<int>>
            ((internal *)&gtest_ar,"0","count",(int *)&local_50,&count);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/parallel_test.cpp"
               ,0x2d,message);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST(Parallel, ForEachThread) {
    std::atomic<int> count{MaxThreadIndex()};
    ForEachThread([&count] { --count; });
    EXPECT_EQ(0, count);
}